

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall google::protobuf::descriptor_unittest::HasHasbitTest::SetUp(HasHasbitTest *this)

{
  internal iVar1;
  ParamType *pPVar2;
  FileDescriptor *pFVar3;
  Message *in_RCX;
  pointer *__ptr;
  char *in_R9;
  string_view input;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  pPVar2 = testing::WithParamInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>::
           GetParam();
  input._M_str = (char *)&this->foo_proto_;
  input._M_len = (size_t)(pPVar2->input_foo_proto)._M_dataplus._M_p;
  iVar1 = (internal)
          TextFormat::ParseFromString
                    ((TextFormat *)(pPVar2->input_foo_proto)._M_string_length,input,in_RCX);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50[0] = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,
               (AssertionResult *)
               "TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_)","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xc84,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  if ((bool)iVar1) {
    pFVar3 = DescriptorPool::BuildFile(&this->pool_,&this->foo_proto_);
    this->foo_ = pFVar3;
  }
  return;
}

Assistant:

void SetUp() override {
    ASSERT_TRUE(
        TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_));
    foo_ = pool_.BuildFile(foo_proto_);
  }